

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool jsonip::parser::
     apply_until_<jsonip::parser::or_<jsonip::parser::new_line,jsonip::parser::notchar_<(char)10>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>,jsonip::grammar::ccomment_end>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  pointer *ppSVar1;
  char *pcVar2;
  Reader *pRVar3;
  char *pcVar4;
  PositionType pcVar5;
  bool bVar6;
  pointer pSVar7;
  PositionType p;
  PositionType p_2;
  iterator iVar8;
  size_t sVar9;
  bool bVar10;
  undefined1 auStack_38 [8];
  State cur_state;
  
  auStack_38 = (undefined1  [8])state->reader_->pos_;
  cur_state.pos_ = (PositionType)state->line_;
  iVar8._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                *)&state->stack_,iVar8,(State *)auStack_38);
  }
  else {
    (iVar8._M_current)->pos_ = (PositionType)auStack_38;
    (iVar8._M_current)->line_ = (size_t)cur_state.pos_;
    ppSVar1 = &(state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  do {
    auStack_38 = (undefined1  [8])state->reader_->pos_;
    cur_state.pos_ = (PositionType)state->line_;
    iVar8._M_current =
         (state->stack_).
         super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (state->stack_).
        super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
      ::
      _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
                ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                  *)&state->stack_,iVar8,(State *)auStack_38);
    }
    else {
      (iVar8._M_current)->pos_ = (PositionType)auStack_38;
      (iVar8._M_current)->line_ = (size_t)cur_state.pos_;
      ppSVar1 = &(state->stack_).
                 super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    pRVar3 = state->reader_;
    pcVar4 = pRVar3->pos_;
    if (((long)pcVar4 - (long)pRVar3->buf_ == pRVar3->len_) || (*pcVar4 != '*')) {
LAB_0010b734:
      bVar10 = false;
    }
    else {
      pcVar2 = pcVar4 + 1;
      pRVar3->pos_ = pcVar2;
      if (((long)pcVar2 - (long)pRVar3->buf_ == pRVar3->len_) || (*pcVar2 != '/'))
      goto LAB_0010b734;
      pRVar3->pos_ = pcVar4 + 2;
      bVar10 = true;
    }
    pcVar5 = pRVar3->pos_;
    if (bVar10 == false) {
      if (state->max_pos_ < pcVar5) {
        state->max_pos_ = pcVar5;
      }
      pRVar3->pos_ = (state->stack_).
                     super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
      pSVar7 = (state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      state->line_ = pSVar7[-1].line_;
    }
    else {
      if (state->max_pos_ < pcVar5) {
        state->max_pos_ = pcVar5;
      }
      pSVar7 = (state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    iVar8._M_current = pSVar7 + -1;
    (state->stack_).
    super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
    if (bVar10 != false) {
      pcVar5 = state->reader_->pos_;
      if (state->max_pos_ < pcVar5) {
        state->max_pos_ = pcVar5;
      }
      pSVar7 = (state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_0010b87d;
    }
    auStack_38 = (undefined1  [8])pRVar3->pos_;
    cur_state.pos_ = (PositionType)state->line_;
    if (iVar8._M_current ==
        (state->stack_).
        super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
      ::
      _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
                ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                  *)&state->stack_,iVar8,(State *)auStack_38);
    }
    else {
      (iVar8._M_current)->pos_ = (PositionType)auStack_38;
      pSVar7[-1].line_ = (size_t)cur_state.pos_;
      ppSVar1 = &(state->stack_).
                 super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    pRVar3 = state->reader_;
    pcVar4 = pRVar3->pos_;
    sVar9 = (long)pcVar4 - (long)pRVar3->buf_;
    if (sVar9 == pRVar3->len_) {
LAB_0010b7c9:
      bVar6 = false;
    }
    else {
      if (*pcVar4 == '\n') {
        pRVar3->pos_ = pcVar4 + 1;
        state->line_ = state->line_ + 1;
      }
      else {
        if ((sVar9 == pRVar3->len_) || (*pcVar4 == '\n')) goto LAB_0010b7c9;
        pRVar3->pos_ = pcVar4 + 1;
      }
      bVar6 = true;
    }
    pcVar5 = pRVar3->pos_;
    if (bVar6) {
      if (state->max_pos_ < pcVar5) {
        state->max_pos_ = pcVar5;
      }
      pSVar7 = (state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (state->max_pos_ < pcVar5) {
        state->max_pos_ = pcVar5;
      }
      pRVar3->pos_ = (state->stack_).
                     super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
      pSVar7 = (state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      state->line_ = pSVar7[-1].line_;
    }
    (state->stack_).
    super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar7 + -1;
  } while (bVar6);
  if (state->max_pos_ < pRVar3->pos_) {
    state->max_pos_ = pRVar3->pos_;
  }
  pRVar3->pos_ = pSVar7[-2].pos_;
  pSVar7 = (state->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  state->line_ = pSVar7[-1].line_;
LAB_0010b87d:
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar7 + -1;
  return bVar10;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = false;

            while (!(var = C1::match(state)))
                if (!C0::match(state)) break;

            var ? state.commit() : state.rollback();

            return var;
        }